

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O0

PcodeOp * __thiscall
Funcdata::newIndirectOp(Funcdata *this,PcodeOp *indeffect,Address *addr,int4 size,uint4 extraFlags)

{
  Varnode *pVVar1;
  Address *pc;
  PcodeOp *op;
  PcodeOp *newop;
  Varnode *newin;
  uint4 extraFlags_local;
  int4 size_local;
  Address *addr_local;
  PcodeOp *indeffect_local;
  Funcdata *this_local;
  
  pVVar1 = newVarnode(this,size,addr,(Datatype *)0x0);
  pc = PcodeOp::getAddr(indeffect);
  op = newOp(this,2,pc);
  op->flags = extraFlags | op->flags;
  newVarnodeOut(this,size,addr,op);
  opSetOpcode(this,op,CPUI_INDIRECT);
  opSetInput(this,op,pVVar1,0);
  pVVar1 = newVarnodeIop(this,indeffect);
  opSetInput(this,op,pVVar1,1);
  opInsertBefore(this,op,indeffect);
  return op;
}

Assistant:

PcodeOp *Funcdata::newIndirectOp(PcodeOp *indeffect,const Address &addr,int4 size,uint4 extraFlags)

{
  Varnode *newin;
  PcodeOp *newop;

  newin = newVarnode(size,addr);
  newop = newOp(2,indeffect->getAddr());
  newop->flags |= extraFlags;
  newVarnodeOut(size,addr,newop);
  opSetOpcode(newop,CPUI_INDIRECT);
  opSetInput(newop,newin,0);
  opSetInput(newop,newVarnodeIop(indeffect),1);
  opInsertBefore(newop,indeffect);
  return newop;
}